

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

bool __thiscall
Memory::LargeHeapBlock::GetObjectHeader
          (LargeHeapBlock *this,void *objectAddress,LargeObjectHeader **ppHeader)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  LargeObjectHeader *pLVar4;
  undefined8 *in_FS_OFFSET;
  
  *ppHeader = (LargeObjectHeader *)0x0;
  pLVar4 = GetHeader(this,objectAddress);
  if ((pLVar4 < (LargeObjectHeader *)(this->super_HeapBlock).address) ||
     ((LargeObjectHeader *)(&this[1].super_HeapBlock._vptr_HeapBlock)[pLVar4->objectIndex] != pLVar4
     )) {
    bVar3 = false;
  }
  else {
    if (this->allocCount <= pLVar4->objectIndex) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x379,"(index < this->allocCount)","index < this->allocCount");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
    *ppHeader = pLVar4;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool
LargeHeapBlock::GetObjectHeader(void* objectAddress, LargeObjectHeader** ppHeader)
{
    (*ppHeader) = nullptr;

    LargeObjectHeader * header = GetHeader(objectAddress);
    if ((char *)header < this->address)
    {
        return false;
    }

    uint index = header->objectIndex;

    if (this->HeaderList()[index] != header)
    {
        // header doesn't match, not a real object
        return false;
    }

    Assert(index < this->allocCount);
    (*ppHeader) = header;
    return true;
}